

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

bool __thiscall QFile::moveToTrash(QFile *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  FileError FVar4;
  QFilePrivate *pQVar5;
  undefined4 extraout_var;
  ulong uVar6;
  long *in_RDI;
  long in_FS_OFFSET;
  QFilePrivate *d;
  QSystemError error;
  QFileSystemEntry trashEntry;
  QFileSystemEntry fileEntry;
  undefined4 in_stack_fffffffffffffea8;
  FileError in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  QFileSystemEntry *in_stack_fffffffffffffeb8;
  QMessageLogger *in_stack_fffffffffffffec0;
  QSystemError *this_00;
  byte local_e1;
  QSystemError local_b0;
  QMessageLogger local_a8;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QSystemError *error_00;
  QFileSystemEntry *in_stack_ffffffffffffffb0;
  QFileSystemEntry *source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QFile *)0x2a32c0);
  bVar2 = QString::isEmpty((QString *)0x2a32d6);
  if (bVar2) {
    iVar3 = (*(pQVar5->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
              super_QObjectData._vptr_QObjectData[7])();
    uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x140))();
    if ((uVar6 & 1) == 0) {
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                 in_stack_fffffffffffffeb4,
                 (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      QMessageLogger::warning(&local_a8,"QFile::remove: Empty or null file name");
      local_e1 = 0;
      goto LAB_002a3586;
    }
  }
  QFileDevice::unsetError
            ((QFileDevice *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  (**(code **)(*in_RDI + 0x70))();
  FVar4 = QFileDevice::error((QFileDevice *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  if (FVar4 == NoError) {
    source = (QFileSystemEntry *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry
              ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (QString *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    error_00 = (QSystemError *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry
              ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    local_b0 = (QSystemError)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = &local_b0;
    QSystemError::QSystemError(this_00);
    bVar2 = QFileSystemEngine::moveFileToTrash(source,in_stack_ffffffffffffffb0,error_00);
    if (bVar2) {
      QFileSystemEntry::filePath(in_stack_fffffffffffffeb8);
      setFileName((QFile *)this_00,&in_stack_fffffffffffffeb8->m_filePath);
      QString::~QString((QString *)0x2a346b);
      QFileDevice::unsetError
                ((QFileDevice *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      local_e1 = 1;
    }
    else {
      QSystemError::toString
                ((QSystemError *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      QFileDevicePrivate::setError
                ((QFileDevicePrivate *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)
                 ,in_stack_fffffffffffffeac,(QString *)0x2a350d);
      QString::~QString((QString *)0x2a3519);
    }
    QFileSystemEntry::~QFileSystemEntry
              ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    QFileSystemEntry::~QFileSystemEntry
              ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    if (bVar2) goto LAB_002a3586;
  }
  local_e1 = 0;
LAB_002a3586:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_e1 & 1);
}

Assistant:

bool
QFile::moveToTrash()
{
    Q_D(QFile);
    if (d->fileName.isEmpty() &&
        !static_cast<QFSFileEngine *>(d->engine())->isUnnamedFile()) {
        qWarning("QFile::remove: Empty or null file name");
        return false;
    }
    unsetError();
    close();
    if (error() == QFile::NoError) {
        QFileSystemEntry fileEntry(d->fileName);
        QFileSystemEntry trashEntry;
        QSystemError error;
        if (QFileSystemEngine::moveFileToTrash(fileEntry, trashEntry, error)) {
            setFileName(trashEntry.filePath());
            unsetError();
            return true;
        }
        d->setError(QFile::RenameError, error.toString());
    }
    return false;
}